

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indlg_tx.c
# Opt level: O2

int tio_input_dialog(int icon_id,char *prompt,int standard_button_set,char **buttons,
                    int button_count,int default_index,int cancel_index)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ushort **ppuVar5;
  size_t sVar6;
  __int32_t **pp_Var7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  char cVar11;
  char *buf_00;
  char *pcVar12;
  int local_15c;
  char buf [256];
  
  iVar3 = 0;
  do {
    buf_00 = buf;
    switch(standard_button_set) {
    case 0:
      goto switchD_0021573c_caseD_0;
    case 1:
      iVar2 = 0;
      break;
    case 2:
      iVar2 = 1;
      break;
    case 3:
      iVar2 = 2;
      break;
    case 4:
      iVar2 = 3;
      break;
    default:
      goto switchD_0021573c_default;
    }
    buttons = (char **)((long)tio_input_dialog::std_btns[0].buttons + (ulong)(uint)(iVar2 << 5));
    button_count = *(uint *)((long)tio_input_dialog::std_btns[0].buttons +
                            (ulong)(uint)(iVar2 << 5) + 0x18);
switchD_0021573c_caseD_0:
    if (button_count == 0) {
      return 0;
    }
    outformat("\\n");
    outformat(prompt);
    outformat(" ");
    uVar4 = 0;
    if (0 < button_count) {
      uVar4 = (ulong)(uint)button_count;
    }
    for (uVar9 = 0; uVar9 != uVar4; uVar9 = uVar9 + 1) {
      if (uVar9 != 0) {
        outformat("/");
      }
      pcVar10 = buttons[uVar9];
      for (lVar8 = 0; pcVar10[lVar8] != '\0'; lVar8 = lVar8 + 1) {
        if (pcVar10[lVar8] == '&') {
          sprintf(buf_00,"%.*s(%c)%s",lVar8,pcVar10,(ulong)(uint)(int)pcVar10[lVar8 + 1]);
          pcVar10 = buf_00;
          break;
        }
      }
      outformat(pcVar10);
    }
    iVar2 = tio_is_html_mode();
    if (iVar2 != 0) {
      outformat("<font face=\'TADS-Input\'>");
    }
    getstring(" >",buf_00,0x100);
    iVar2 = tio_is_html_mode();
    if (iVar2 != 0) {
      outformat("</font>");
    }
    while ((lVar8 = (long)*buf_00, -1 < lVar8 &&
           (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + lVar8 * 2 + 1) & 0x20) != 0))) {
      buf_00 = buf_00 + 1;
    }
    sVar6 = strlen(buf_00);
    if (sVar6 == 1) {
      for (uVar9 = 0; uVar9 != uVar4; uVar9 = uVar9 + 1) {
        pcVar10 = buttons[uVar9];
        do {
          pcVar12 = pcVar10 + 1;
          cVar1 = *pcVar10;
          if (cVar1 == '\0') goto LAB_0021589c;
          pcVar10 = pcVar12;
        } while (cVar1 != '&');
        pp_Var7 = __ctype_toupper_loc();
        if ((*pp_Var7)[*pcVar12] == (*pp_Var7)[lVar8]) {
          return (int)uVar9 + 1;
        }
LAB_0021589c:
      }
    }
    iVar2 = 0;
    for (uVar9 = 0; uVar9 != uVar4; uVar9 = uVar9 + 1) {
      pcVar10 = buttons[uVar9];
      pcVar12 = buf_00;
      while( true ) {
        cVar1 = *pcVar12;
        if ((long)cVar1 == 0) break;
        cVar11 = *pcVar10;
        if (cVar11 == '&') {
          cVar11 = pcVar10[1];
          pcVar10 = pcVar10 + 1;
        }
        else if (cVar11 == '\0') goto LAB_00215903;
        pp_Var7 = __ctype_toupper_loc();
        if ((*pp_Var7)[cVar1] != (*pp_Var7)[cVar11]) goto LAB_00215903;
        pcVar12 = pcVar12 + 1;
        pcVar10 = pcVar10 + 1;
      }
      local_15c = (int)uVar9;
LAB_00215903:
      iVar2 = iVar2 + (uint)(cVar1 == '\0');
    }
  } while (iVar2 != 1);
  iVar3 = local_15c + 1;
switchD_0021573c_default:
  return iVar3;
}

Assistant:

int tio_input_dialog(int icon_id, const char *prompt,
                     int standard_button_set,
                     const char **buttons, int button_count,
                     int default_index, int cancel_index)
{
    /* ignore the icon ID - we can't display an icon in text mode */
    VARUSED(icon_id);

    /* keep going until we get a valid response */
    for (;;)
    {
        int i;
        char buf[256];
        const char *p;
        const char *cur;
        char *resp;
        int match_cnt;
        int last_found;
        static const struct
        {
            const char *buttons[3];
            int button_count;
        } std_btns[] =
        {
            { { "&OK" },                    1 },
            { { "&OK", "&Cancel" },         2 },
            { { "&Yes", "&No" },            2 },
            { { "&Yes", "&No", "&Cancel" }, 3 }
        };

        /* 
         *   if we have a standard button set selected, get our button
         *   labels 
         */
        switch(standard_button_set)
        {
        case 0:
            /* use the explicit buttons provided */
            break;

        case OS_INDLG_OK:
            i = 0;

        use_std_btns:
            /* use the selected standard button set */
            buttons = (const char **)std_btns[i].buttons;
            button_count = std_btns[i].button_count;
            break;

        case OS_INDLG_OKCANCEL:
            i = 1;
            goto use_std_btns;

        case OS_INDLG_YESNO:
            i = 2;
            goto use_std_btns;

        case OS_INDLG_YESNOCANCEL:
            i = 3;
            goto use_std_btns;

        default:
            /* 
             *   we don't recognize other standard button sets - return an
             *   error 
             */
            return 0;
        }

        /* 
         *   if there are no buttons defined, they'll never be able to
         *   respond, so we'd just loop forever - rather than let that
         *   happen, return failure 
         */
        if (button_count == 0)
            return 0;

        /* display a newline and the prompt string */
        outformat("\\n");
        outformat((char *)prompt);
        outformat(" ");

        /* display the response */
        for (i = 0 ; i < button_count ; ++i)
        {
            /* 
             *   display a slash to separate responses, if this isn't the
             *   first one 
             */
            if (i != 0)
                outformat("/");

            /* get the current button */
            cur = buttons[i];

            /* 
             *   Look for a "&" in the response string.  If we find it,
             *   remove the "&" and enclose the shortcut key in parens.  
             */
            for (p = cur ; *p != '&' && *p != '\0' ; ++p) ;

            /* if we found the "&", put the next character in parens */
            if (*p == '&')
            {
                /* reformat the response string */
                sprintf(buf, "%.*s(%c)%s", (int)(p - cur), cur, *(p+1), p+2);

                /* display it */
                outformat(buf);
            }
            else
            {
                /* no '&' - just display the response string as-is */
                outformat((char *)cur);
            }
        }

        /* if we're in HTML mode, switch to input font */
        if (tio_is_html_mode())
            outformat("<font face='TADS-Input'>");

        /* read the response */
        getstring(" >", buf, sizeof(buf));

        /* if we're in HTML mode, close the input font tag */
        if (tio_is_html_mode())
            outformat("</font>");

        /* skip any leading spaces in the reply */
        for (resp = buf ; t_isspace(*resp) ; ++resp) ;

        /* if it's one character, check it against the shortcut keys */
        if (strlen(resp) == 1)
        {
            /* scan the responses */
            for (i = 0 ; i < button_count ; ++i)
            {
                /* look for a '&' in this button */
                for (p = buttons[i] ; *p != '&' && *p != '\0' ; ++p) ;

                /* if we found the '&', check the shortcut */
                if (*p == '&' && toupper(*(p+1)) == toupper(*resp))
                {
                    /* 
                     *   this is the one - return the current index
                     *   (bumping it by one to get a 1-based value) 
                     */
                    return i + 1;
                }
            }
        }

        /* 
         *   Either it's not a one-character reply, or it didn't match a
         *   short-cut - check it against the leading substrings of the
         *   responses.  If it matches exactly one of the responses in its
         *   leading substring, use that response.  
         */
        for (i = 0, match_cnt = 0 ; i < button_count ; ++i)
        {
            const char *p1;
            const char *p2;

            /* 
             *   compare this response to the user's response; skip any
             *   '&' in the button label 
             */
            for (p1 = resp, p2 = buttons[i] ; *p1 != '\0' && *p2 != '\0' ;
                 ++p1, ++p2)
            {
                /* if this is a '&' in the button label, skip it */
                if (*p2 == '&')
                    ++p2;

                /* if these characters don't match, it's no match */
                if (toupper(*p1) != toupper(*p2))
                    break;
            }

            /* 
             *   if we reached the end of the user's response, we have a
             *   match in the leading substring - count it and remember
             *   this as the last one, but keep looking, since we need to
             *   make sure we don't have any other matches 
             */
            if (*p1 == '\0')
            {
                ++match_cnt;
                last_found = i;
            }
        }
        
        /* 
         *   if we found exactly one match, return it (adjusting to a
         *   1-based index); if we found more or less than one match, it's
         *   not a valid response, so start over with a new prompt 
         */
        if (match_cnt == 1)
            return last_found + 1;
    }
}